

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<kj::HashMap<kj::String,_int>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<kj::String,_int>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  StringPtr *target;
  size_t size_local;
  ArrayBuilder<kj::StringPtr> *this_local;
  
  pcVar3 = (char *)size(this);
  if (__file <= pcVar3) {
    lVar1 = *(long *)this;
    while ((ulong)(lVar1 + (long)__file * 0x20) < *(ulong *)(this + 8)) {
      lVar2 = *(long *)(this + 8);
      *(StringPtr **)(this + 8) = (StringPtr *)(lVar2 + -0x20);
      dtor<kj::HashMap<kj::String,int>::Entry>((StringPtr *)(lVar2 + -0x20));
    }
    return (int)*(ulong *)(this + 8);
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array.h"
             ,0x1a3,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }